

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterators.hpp
# Opt level: O3

void __thiscall
protozero::
iterator_range<protozero::const_fixed_iterator<unsigned_int>,_std::pair<protozero::const_fixed_iterator<unsigned_int>,_protozero::const_fixed_iterator<unsigned_int>_>_>
::drop_front(iterator_range<protozero::const_fixed_iterator<unsigned_int>,_std::pair<protozero::const_fixed_iterator<unsigned_int>,_protozero::const_fixed_iterator<unsigned_int>_>_>
             *this)

{
  char *pcVar1;
  assert_error *this_00;
  
  pcVar1 = (this->
           super_pair<protozero::const_fixed_iterator<unsigned_int>,_protozero::const_fixed_iterator<unsigned_int>_>
           ).first.m_data;
  if (pcVar1 != (this->
                super_pair<protozero::const_fixed_iterator<unsigned_int>,_protozero::const_fixed_iterator<unsigned_int>_>
                ).second.m_data) {
    (this->
    super_pair<protozero::const_fixed_iterator<unsigned_int>,_protozero::const_fixed_iterator<unsigned_int>_>
    ).first.m_data = pcVar1 + 4;
    return;
  }
  this_00 = (assert_error *)__cxa_allocate_exception(0x10);
  assert_error::assert_error(this_00,"!empty()");
  __cxa_throw(this_00,&assert_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

constexpr iterator begin() const noexcept {
        return this->first;
    }